

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_pea_32_aw(void)

{
  uint uVar1;
  uint ea;
  
  uVar1 = m68ki_read_imm_16();
  m68ki_push_32((int)(short)uVar1);
  return;
}

Assistant:

static void m68k_op_pea_32_aw(void)
{
	uint ea = EA_AW_32();

	m68ki_push_32(ea);
}